

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

void BinaryenStringSliceWTFSetStart(BinaryenExpressionRef expr,BinaryenExpressionRef startExpr)

{
  bool bVar1;
  Expression *expression;
  BinaryenExpressionRef startExpr_local;
  BinaryenExpressionRef expr_local;
  
  bVar1 = wasm::Expression::is<wasm::StringSliceWTF>(expr);
  if (!bVar1) {
    __assert_fail("expression->is<StringSliceWTF>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0x130b,
                  "void BinaryenStringSliceWTFSetStart(BinaryenExpressionRef, BinaryenExpressionRef)"
                 );
  }
  if (startExpr != (BinaryenExpressionRef)0x0) {
    *(BinaryenExpressionRef *)(expr + 2) = startExpr;
    return;
  }
  __assert_fail("startExpr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0x130c,
                "void BinaryenStringSliceWTFSetStart(BinaryenExpressionRef, BinaryenExpressionRef)")
  ;
}

Assistant:

void BinaryenStringSliceWTFSetStart(BinaryenExpressionRef expr,
                                    BinaryenExpressionRef startExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<StringSliceWTF>());
  assert(startExpr);
  static_cast<StringSliceWTF*>(expression)->start = (Expression*)startExpr;
}